

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.hpp
# Opt level: O3

void __thiscall
cmdline::parser::add<std::__cxx11::string>
          (parser *this,string *name,char short_name,string *desc,bool need,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *def)

{
  pointer pcVar1;
  undefined7 in_register_00000011;
  undefined7 in_register_00000081;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  pcVar1 = (def->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar1,pcVar1 + def->_M_string_length);
  add<std::__cxx11::string,cmdline::default_reader<std::__cxx11::string>>
            (this,name,CONCAT71(in_register_00000011,short_name) & 0xffffffff,desc,
             CONCAT71(in_register_00000081,need) & 0xffffffff,(string *)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void add(const std::string &name, char short_name = 0,
           const std::string &desc = "", bool need = true, const T def = T()) {
    add(name, short_name, desc, need, def, default_reader<T>());
  }